

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.h
# Opt level: O2

void __thiscall adios2::core::engine::ssc::Buffer::Buffer(Buffer *this,size_t capacity)

{
  uint8_t *puVar1;
  
  puVar1 = (uint8_t *)malloc(capacity);
  this->m_Buffer = puVar1;
  this->m_Capacity = capacity;
  this->m_Size = 0;
  return;
}

Assistant:

Buffer(const size_t capacity = 1)
    {
        m_Buffer = reinterpret_cast<uint8_t *>(malloc(capacity));
        m_Capacity = capacity;
        m_Size = 0;
    }